

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall gl4cts::AdvancedUsageMultiStage::Run(AdvancedUsageMultiStage *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *pGVar1;
  bool bVar2;
  GLuint GVar3;
  void *data_00;
  GLuint *ebo;
  long lVar4;
  GLint p3;
  GLint p2;
  GLuint *local_170;
  GLint p1;
  GLenum draw_buffers [2];
  char *xfb_var [2];
  GLuint data [67];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92cc,&p1);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d2,&p2);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x92d0,&p3);
  lVar4 = 0;
  if (((7 < p1) && (1 < p2)) && (7 < p3)) {
    lVar4 = 0;
    GVar3 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                      (&this->super_SACSubcaseBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nout uint o_atomic_inc;\nout uint o_atomic_dec;\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  gl_Position = i_vertex;\n  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);\n  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);\n}"
                       ,(char *)0x0,(char *)0x0,
                       "#version 420 core\nlayout(location = 0) out uvec4 o_color[2];\nlayout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;\nlayout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));\n}"
                       ,(char *)0x0,p3._0_1_);
    this->prog_ = GVar3;
    xfb_var[0] = "o_atomic_inc";
    xfb_var[1] = "o_atomic_dec";
    glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,GVar3,2,xfb_var,0x8c8d);
    gl4cts::anon_unknown_0::SACSubcaseBase::LinkProgram(&this->super_SACSubcaseBase,this->prog_);
    data_00 = operator_new(0x400);
    do {
      *(undefined4 *)((long)data_00 + lVar4) = 100;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x400);
    buffers = &this->counter_buffer_;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x400,data_00,0x88ea);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    pGVar1 = this->xfb_buffer_;
    glu::CallLogWrapper::glGenBuffers(this_00,2,pGVar1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*pGVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,1000,(void *)0x0,0x88e2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
    local_170 = pGVar1;
    glu::CallLogWrapper::glGenTextures(this_00,2,this->rt_);
    lVar4 = 0x11;
    do {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->xfb_buffer_[lVar4 + -0xb]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
      lVar4 = lVar4 + 1;
    } while (lVar4 == 0x12);
    pGVar1 = &this->fbo_;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,pGVar1);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*pGVar1);
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce0,this->rt_[0],0);
    ebo = (GLuint *)(ulong)this->rt_[1];
    glu::CallLogWrapper::glFramebufferTexture(this_00,0x8d40,0x8ce1,this->rt_[1],0);
    draw_buffers[0] = 0x8ce0;
    draw_buffers[1] = 0x8ce1;
    glu::CallLogWrapper::glDrawBuffers(this_00,2,draw_buffers);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,0);
    gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
              (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,ebo);
    glu::CallLogWrapper::glBindBufferRange(this_00,0x92c0,1,*buffers,0x10,0x20);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,7,*buffers);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,*local_170);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,1,this->xfb_buffer_[1]);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,*pGVar1);
    glu::CallLogWrapper::glViewport(this_00,0,0,8,8);
    glu::CallLogWrapper::glUseProgram(this_00,this->prog_);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->vao_);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,4);
    glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
    glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*local_170);
    GVar3 = 0xc;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0xc,data + 0x40);
    bVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                      ((SACSubcaseBase *)0x43,(GLuint)data,(GLuint *)0x64,GVar3);
    lVar4 = -1;
    if (bVar2) {
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce1);
      glu::CallLogWrapper::glReadPixels(this_00,0,0,8,8,0x8d94,0x1405,data);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->xfb_buffer_[1]);
      GVar3 = 0xc;
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0xc,data + 0x40);
      bVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        ((SACSubcaseBase *)0x43,(GLuint)data,(GLuint *)0x21,GVar3);
      if (bVar2) {
        bVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,0x20,0xa7);
        if (bVar2) {
          bVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,0x80,0x21);
          lVar4 = (ulong)bVar2 - 1;
        }
      }
    }
    operator_delete(data_00,0x400);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{

		GLint p1, p2, p3;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &p1);
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &p2);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &p3);
		if (p1 < 8 || p2 < 2 || p3 < 8)
		{
			return NO_ERROR;
		}

		// create program
		const char* src_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "out uint o_atomic_inc;" NL
			"out uint o_atomic_dec;" NL "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
			"layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL "void main() {" NL
			"  gl_Position = i_vertex;" NL "  o_atomic_inc = atomicCounterIncrement(ac_counter_inc);" NL
			"  o_atomic_dec = atomicCounterDecrement(ac_counter_dec);" NL "}";
		const char* src_fs = "#version 420 core" NL "layout(location = 0) out uvec4 o_color[2];" NL
							 "layout(binding = 1, offset = 16) uniform atomic_uint ac_counter_inc;" NL
							 "layout(binding = 7, offset = 128) uniform atomic_uint ac_counter_dec;" NL
							 "void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter_inc));" NL
							 "  o_color[1] = uvec4(atomicCounterDecrement(ac_counter_dec));" NL "}";
		prog_				   = CreateProgram(src_vs, NULL, NULL, NULL, src_fs, false);
		const char* xfb_var[2] = { "o_atomic_inc", "o_atomic_dec" };
		glTransformFeedbackVaryings(prog_, 2, xfb_var, GL_SEPARATE_ATTRIBS);
		LinkProgram(prog_);

		// create atomic counter buffer
		std::vector<GLuint> init_data(256, 100);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, (GLsizeiptr)(init_data.size() * sizeof(GLuint)), &init_data[0],
					 GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create transform feedback buffers
		glGenBuffers(2, xfb_buffer_);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 1000, NULL, GL_STREAM_COPY);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(2, rt_);
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, rt_[0], 0);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT1, rt_[1], 0);
		const GLenum draw_buffers[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
		glDrawBuffers(2, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// draw
		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 1, counter_buffer_, 16, 32);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 7, counter_buffer_);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, xfb_buffer_[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, xfb_buffer_[1]);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glUseProgram(prog_);
		glBindVertexArray(vao_);
		glBeginTransformFeedback(GL_TRIANGLES);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndTransformFeedback();

		// validate
		GLuint data[s * s + 3];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[0]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), &data[s * s]);
		if (!CheckCounterValues(s * s + 3, data, 100))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, xfb_buffer_[1]);
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 3 * sizeof(GLuint), &data[s * s]);
		if (!CheckCounterValues(s * s + 3, data, 33))
			return ERROR;

		if (!CheckFinalCounterValue(counter_buffer_, 32, 167))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 128, 33))
			return ERROR;

		return NO_ERROR;
	}